

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O3

void __thiscall deci_FlexLexer::yyunput(deci_FlexLexer *this,int c,char *yy_bp)

{
  int *piVar1;
  char *pcVar2;
  yy_buffer_state *pyVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  
  pcVar8 = this->yy_c_buf_p;
  *pcVar8 = this->yy_hold_char;
  pyVar3 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  pcVar2 = pyVar3->yy_ch_buf;
  if (pcVar8 < pcVar2 + 2) {
    iVar7 = pyVar3->yy_buf_size;
    pcVar5 = pcVar2 + (long)iVar7 + 2;
    pcVar6 = pcVar2 + (long)this->yy_n_chars + 2;
    if (pcVar2 < pcVar6) {
      do {
        pcVar2 = pcVar6 + -1;
        pcVar6 = pcVar6 + -1;
        pcVar5[-1] = *pcVar2;
        pcVar5 = pcVar5 + -1;
        pyVar3 = this->yy_buffer_stack[this->yy_buffer_stack_top];
        pcVar2 = pyVar3->yy_ch_buf;
      } while (pcVar2 < pcVar6);
      iVar7 = pyVar3->yy_buf_size;
    }
    iVar4 = (int)pcVar5 - (int)pcVar6;
    pcVar8 = pcVar8 + iVar4;
    yy_bp = yy_bp + iVar4;
    this->yy_n_chars = iVar7;
    pyVar3->yy_n_chars = iVar7;
    if (pcVar8 < pcVar2 + 2) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"flex scanner push-back overflow");
    }
  }
  pcVar8[-1] = (char)c;
  if (c == 10) {
    piVar1 = &(this->super_FlexLexer).yylineno;
    *piVar1 = *piVar1 + -1;
  }
  (this->super_FlexLexer).yytext = yy_bp;
  this->yy_hold_char = pcVar8[-1];
  this->yy_c_buf_p = pcVar8 + -1;
  return;
}

Assistant:

void yyFlexLexer::yyunput( int c, char* yy_bp)
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

    if ( c == '\n' ){
        --yylineno;
    }

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}